

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjPlaneWidth(int componentID,int width,int subsamp)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  long *in_FS_OFFSET;
  int retval;
  int nc;
  int pw;
  uint local_18;
  
  if (((in_ESI < 1) || (in_EDX < 0)) || (5 < in_EDX)) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjPlaneWidth(): Invalid argument");
    local_18 = 0xffffffff;
  }
  else {
    iVar1 = 3;
    if (in_EDX == 3) {
      iVar1 = 1;
    }
    if ((in_EDI < 0) || (iVar1 <= in_EDI)) {
      snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjPlaneWidth(): Invalid argument");
      local_18 = 0xffffffff;
    }
    else {
      local_18 = (in_ESI + tjMCUWidth[in_EDX] / 8) - 1U & (tjMCUWidth[in_EDX] / 8 - 1U ^ 0xffffffff)
      ;
      if (in_EDI != 0) {
        local_18 = (int)(local_18 << 3) / tjMCUWidth[in_EDX];
      }
    }
  }
  return local_18;
}

Assistant:

DLLEXPORT int tjPlaneWidth(int componentID, int width, int subsamp)
{
  int pw, nc, retval = 0;

  if (width < 1 || subsamp < 0 || subsamp >= TJ_NUMSAMP)
    THROWG("tjPlaneWidth(): Invalid argument");
  nc = (subsamp == TJSAMP_GRAY ? 1 : 3);
  if (componentID < 0 || componentID >= nc)
    THROWG("tjPlaneWidth(): Invalid argument");

  pw = PAD(width, tjMCUWidth[subsamp] / 8);
  if (componentID == 0)
    retval = pw;
  else
    retval = pw * 8 / tjMCUWidth[subsamp];

bailout:
  return retval;
}